

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_clipper.cpp
# Opt level: O1

void __thiscall Clipper::DoRemoveClipRange(Clipper *this,angle_t start,angle_t end)

{
  uint uVar1;
  uint uVar2;
  ClipNode *pCVar3;
  ClipNode *pCVar4;
  ClipNode *p;
  ClipNode *pCVar5;
  ClipNode *pCVar6;
  
  pCVar6 = this->cliphead;
  if (pCVar6 != (ClipNode *)0x0) {
    pCVar5 = this->cliphead;
    do {
      if (end <= pCVar6->start) break;
      if ((pCVar6->start < start) || (end < pCVar6->end)) {
        pCVar3 = pCVar6->next;
      }
      else {
        pCVar3 = pCVar6->next;
        if (pCVar5 == pCVar6) {
          pCVar5 = pCVar5->next;
          this->cliphead = pCVar5;
        }
        else {
          pCVar4 = pCVar6->prev;
          if (pCVar4 != (ClipNode *)0x0) {
            pCVar4->next = pCVar3;
          }
          if (pCVar6->next != (ClipNode *)0x0) {
            pCVar6->next->prev = pCVar4;
          }
        }
        pCVar6->next = ClipNode::freelist;
        ClipNode::freelist = pCVar6;
      }
      pCVar6 = pCVar3;
    } while (pCVar6 != (ClipNode *)0x0);
    for (pCVar6 = this->cliphead; pCVar6 != (ClipNode *)0x0; pCVar6 = pCVar6->next) {
      uVar1 = pCVar6->start;
      if (uVar1 <= end && start <= uVar1) {
        pCVar6->start = end;
        return;
      }
      uVar2 = pCVar6->end;
      if (end < uVar2 || uVar2 < start) {
        if (uVar1 < start && end < uVar2) {
          if (ClipNode::freelist == (ClipNode *)0x0) {
            pCVar5 = (ClipNode *)operator_new(0x18);
          }
          else {
            pCVar5 = ClipNode::freelist;
            ClipNode::freelist = ClipNode::freelist->next;
          }
          pCVar5->start = end;
          pCVar5->end = uVar2;
          pCVar5->prev = (ClipNode *)0x0;
          pCVar5->next = (ClipNode *)0x0;
          pCVar6->end = start;
          pCVar5->next = pCVar6->next;
          pCVar5->prev = pCVar6;
          pCVar6->next = pCVar5;
          if (pCVar5->next == (ClipNode *)0x0) {
            return;
          }
          pCVar5->next->prev = pCVar5;
          return;
        }
      }
      else {
        pCVar6->end = start;
      }
    }
  }
  return;
}

Assistant:

void Clipper::DoRemoveClipRange(angle_t start, angle_t end)
{
	ClipNode *node, *temp;

	if (cliphead)
	{
		//check to see if range contains any old ranges
		node = cliphead;
		while (node != NULL && node->start < end)
		{
			if (node->start >= start && node->end <= end)
			{
				temp = node;
				node = node->next;
				RemoveRange(temp);
			}
			else
			{
				node = node->next;
			}
		}
		
		//check to see if range overlaps a range (or possibly 2)
		node = cliphead;
		while (node != NULL)
		{
			if (node->start >= start && node->start <= end)
			{
				node->start = end;
				break;
			}
			else if (node->end >= start && node->end <= end)
			{
				node->end=start;
			}
			else if (node->start < start && node->end > end)
			{
				temp=ClipNode::NewRange(end, node->end);
				node->end=start;
				temp->next=node->next;
				temp->prev=node;
				node->next=temp;
				if (temp->next) temp->next->prev=temp;
				break;
			}
			node = node->next;
		}
	}
}